

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

void __thiscall
BitsEqualFailure::BitsEqualFailure
          (BitsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          unsigned_long expected,unsigned_long actual,unsigned_long mask,size_t byteCount,
          SimpleString *text)

{
  SimpleString *this_00;
  char *pcVar1;
  char *pcVar2;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_00164d48;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffa0,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)&stack0xffffffffffffffa0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa0);
  StringFromMaskedBits((unsigned_long)&stack0xffffffffffffffc0,expected,mask);
  StringFromMaskedBits((unsigned_long)&stack0xffffffffffffffb0,actual,mask);
  pcVar1 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffc0);
  pcVar2 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffb0);
  StringFromFormat(&stack0xffffffffffffffa0,"expected <%s>\n\tbut was  <%s>",pcVar1,pcVar2);
  SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffa0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

BitsEqualFailure::BitsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, unsigned long expected, unsigned long actual,
                                   unsigned long mask, size_t byteCount, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromMaskedBits(expected, mask, byteCount), StringFromMaskedBits(actual, mask, byteCount));
}